

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::DrawFrameAndTitle(Window *this)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  difference_type dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string adjusted;
  string local_30;
  
  box(this->frame,0,0);
  first._M_current = (this->title)._M_dataplus._M_p;
  dVar1 = utf8::distance<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(first._M_current + (this->title)._M_string_length));
  if ((dVar1 != 0) && (7 < (long)this->width)) {
    text::Ellipsize(&local_30,&this->title,(long)this->width - 6);
    std::operator+(&local_70," ",&local_30);
    std::operator+(&adjusted,&local_70," ");
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_30);
    wmove(this->frame,0,2);
    if ((this->frame != (WINDOW *)0x0) && (adjusted._M_dataplus._M_p != (pointer)0x0)) {
      waddnstr(this->frame,adjusted._M_dataplus._M_p,0xffffffffffffffff);
    }
    std::__cxx11::string::~string((string *)&adjusted);
  }
  (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x31])(this);
  return;
}

Assistant:

void Window::DrawFrameAndTitle() {
    ASSERT_MAIN_THREAD();

    box(this->frame, 0, 0);

    /* draw the title, if one is specified */
    size_t titleLen = u8len(this->title);
    if (titleLen > 0) {
        int max = this->width - 4; /* 4 = corner + space + space + corner */
        if (max > 3) { /* 3 = first character plus ellipse (e.g. 'F..')*/
            std::string adjusted = " " + text::Ellipsize(this->title, (size_t) max - 2) + " ";
            wmove(this->frame, 0, 2);
            checked_waddstr(this->frame, adjusted.c_str());
        }
    }

    this->DecorateFrame();
}